

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.h
# Opt level: O0

iterator __thiscall Tree<NULLC::Range>::find(Tree<NULLC::Range> *this,Range *key)

{
  bool bVar1;
  node<NULLC::Range> *local_30;
  iterator local_28;
  node_type *curr;
  Range *key_local;
  Tree<NULLC::Range> *this_local;
  
  local_28 = this->root;
  while( true ) {
    if (local_28 == (iterator)0x0) {
      return (iterator)0x0;
    }
    bVar1 = NULLC::Range::operator==(&local_28->key,key);
    if (bVar1) break;
    bVar1 = NULLC::Range::operator<(key,&local_28->key);
    if (bVar1) {
      local_30 = local_28->left;
    }
    else {
      local_30 = local_28->right;
    }
    local_28 = local_30;
  }
  return local_28;
}

Assistant:

iterator find(const T& key)
	{
		node_type *curr = root;

		while(curr)
		{
			if(curr->key == key)
				return iterator(curr);

			curr = key < curr->key ? curr->left : curr->right;
		}

		return iterator(NULL);
	}